

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O2

void __kmp_dispatch_init<unsigned_int>
               (ident_t *loc,int gtid,sched_type schedule,uint lb,uint ub,signed_t st,signed_t chunk
               ,int push_ws)

{
  kmp_int32 *pkVar1;
  double base;
  int iVar2;
  kmp_info_t *pkVar3;
  kmp_team_p *pkVar4;
  kmp_disp_t *pkVar5;
  sched_type sVar6;
  uint uVar7;
  uint uVar8;
  unsigned_t uVar9;
  sched_type *psVar10;
  code *pcVar11;
  ulong uVar12;
  uint uVar13;
  kmp_uint32 kVar14;
  code *pcVar15;
  void *obj;
  uint uVar16;
  ulong iterations;
  cons_type cVar17;
  kmp_info_t *pkVar18;
  int iVar19;
  sched_type sVar20;
  sched_type sVar21;
  dispatch_private_info_t *pdVar22;
  uint uVar23;
  bool bVar24;
  bool bVar25;
  longdouble in_ST0;
  longdouble x;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar26;
  longdouble in_ST3;
  longdouble lVar27;
  longdouble lVar28;
  longdouble lVar29;
  longdouble lVar30;
  longdouble lVar31;
  kmp_uint64 kStackY_160;
  uint local_108;
  dispatch_shared_info_t *local_100;
  ulong local_c0;
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  pkVar18 = (kmp_info_t *)__kmp_threads;
  pkVar3 = __kmp_threads[gtid];
  pkVar4 = (pkVar3->th).th_team;
  iVar2 = (pkVar4->t).t_serialized;
  (pkVar3->th).th_ident = loc;
  bVar25 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    pkVar18 = *(kmp_info_t **)((long)pkVar18 + (long)gtid * 8);
    if ((*(int *)(pkVar18->th_pad + 0x20) == 0) &&
       ((pkVar3->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar25 = (pkVar4->t).t_active_level == 1;
    }
    else {
      bVar25 = false;
    }
  }
  local_108 = (uint)pkVar18;
  pkVar5 = (pkVar3->th).th_dispatch;
  if (iVar2 == 0) {
    local_108 = pkVar5->th_disp_index;
    pkVar5->th_disp_index = local_108 + 1;
    pdVar22 = ((pkVar3->th).th_dispatch)->th_disp_buffer +
              (ulong)local_108 % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_100 = (pkVar4->t).t_disp_buffer +
                (ulong)local_108 % (ulong)(uint)__kmp_dispatch_num_buffers;
  }
  else {
    pdVar22 = pkVar5->th_disp_buffer;
  }
  sVar6 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  if ((schedule >> 0x1e & 1) != 0) {
    sVar6 = kmp_sch_static_steal;
  }
  bVar24 = sVar6 - kmp_nm_lower < 0x28;
  sVar20 = sVar6 - 0x80;
  if (!bVar24) {
    sVar20 = sVar6;
  }
  pkVar18 = (kmp_info_t *)(ulong)sVar20;
  pdVar22->nomerge = (uint)bVar24;
  sVar6 = sVar20 - kmp_sch_lower;
  if ((sVar20 & kmp_ord_lower) == 0) {
    sVar6 = sVar20;
  }
  pdVar22->type_size = 4;
  pdVar22->ordered = (sVar20 & kmp_ord_lower) >> 6;
  if (sVar6 == kmp_sch_runtime) {
    sVar20 = (pkVar4->t).t_sched.field_0.r_sched_type;
    if (sVar20 == kmp_sch_default) {
      psVar10 = &__kmp_static;
LAB_00147699:
      sVar20 = *psVar10;
    }
    else if (sVar20 == kmp_sch_guided_chunked) {
      psVar10 = &__kmp_guided;
      goto LAB_00147699;
    }
    chunk = (pkVar4->t).t_sched.field_0.chunk;
    local_c0 = (ulong)chunk;
LAB_001476a6:
    if (sVar20 == kmp_sch_auto) {
      sVar20 = __kmp_auto;
    }
    if (sVar20 == kmp_sch_runtime_simd) {
      sVar6 = (pkVar4->t).t_sched.field_0.r_sched_type;
      sVar20 = kmp_sch_static_balanced_chunked;
      if (((sVar6 & 0xfffffffb) != kmp_sch_default) && (sVar6 != __kmp_static)) {
        sVar20 = sVar6;
        if (sVar6 == __kmp_guided) {
          sVar20 = kmp_sch_guided_simd;
        }
        if (sVar6 == kmp_sch_guided_chunked) {
          sVar20 = kmp_sch_guided_simd;
        }
        chunk = chunk * (pkVar4->t).t_sched.field_0.chunk;
      }
      local_c0 = (ulong)chunk;
    }
    else if (sVar20 == kmp_sch_guided_analytical_chunked) {
      if ((pkVar3->th).th_team_nproc < 0x100001) {
        sVar20 = kmp_sch_guided_analytical_chunked;
      }
      else {
        pkVar18 = (kmp_info_t *)0x40059;
        __kmp_msg_format(&local_48,0x40059);
        __kmp_msg(kmp_ms_warning);
        sVar20 = kmp_sch_guided_iterative_chunked;
      }
    }
    (pdVar22->u).p32.field_6.parm1 = chunk;
    sVar21 = sVar20;
  }
  else {
    local_c0 = (ulong)chunk;
    sVar20 = __kmp_guided;
    if ((sVar6 == kmp_sch_guided_chunked) ||
       (sVar21 = __kmp_static, sVar20 = sVar6, sVar6 != kmp_sch_default)) {
      if (chunk < 2) {
        chunk = 1;
      }
      goto LAB_001476a6;
    }
  }
  uVar23 = sVar21 - kmp_sch_static_chunked;
  if (0xe < uVar23) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/daniel-schuermann[P]openmp/runtime/src/kmp_dispatch.cpp"
                       ,0x2c9);
  }
  (pdVar22->u).p32.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    cVar17 = ct_pdo_ordered - (pdVar22->ordered == 0);
    pkVar18 = (kmp_info_t *)(ulong)cVar17;
    __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,cVar17,loc);
LAB_0014783c:
    bVar24 = false;
    iterations = 0;
    if (lb <= ub) {
      uVar7 = (ub - lb) / (uint)st;
LAB_00147852:
      bVar24 = false;
      iterations = (ulong)(uVar7 + 1);
    }
  }
  else {
    if (st != 1) {
      if (-1 < st) goto LAB_0014783c;
      bVar24 = false;
      iterations = 0;
      if (lb < ub) goto LAB_00147856;
      uVar7 = (lb - ub) / (uint)-st;
      goto LAB_00147852;
    }
    iterations = 0;
    bVar24 = true;
    if (lb <= ub) {
      iterations = (ulong)((ub - lb) + 1);
    }
  }
LAB_00147856:
  (pdVar22->u).p32.lb = lb;
  (pdVar22->u).p32.ub = ub;
  (pdVar22->u).p32.st = st;
  uVar7 = (uint)iterations;
  (pdVar22->u).p32.tc = uVar7;
  if (iVar2 == 0) {
    if (pdVar22->ordered == 0) {
      pcVar11 = __kmp_dispatch_dxo_error;
      pcVar15 = __kmp_dispatch_deo_error;
    }
    else {
      pdVar22->ordered_bumped = 0;
      (pdVar22->u).p64.field_6.parm1 = 1;
      pcVar11 = __kmp_dispatch_dxo<unsigned_int>;
      pcVar15 = __kmp_dispatch_deo<unsigned_int>;
    }
    ((pkVar3->th).th_dispatch)->th_deo_fcn = pcVar15;
    ((pkVar3->th).th_dispatch)->th_dxo_fcn = pcVar11;
    pkVar18 = pkVar3;
  }
  if (__kmp_env_consistency_check != 0) {
    cVar17 = ct_pdo_ordered - (pdVar22->ordered == 0);
    if (push_ws == 0) {
      pkVar18 = (kmp_info_t *)(ulong)cVar17;
      __kmp_check_workshare(gtid,cVar17,loc);
      cVar17 = ct_none;
    }
    else {
      pkVar18 = (kmp_info_t *)(ulong)cVar17;
      __kmp_push_workshare(gtid,cVar17,loc);
    }
    pdVar22->pushed_ws = cVar17;
  }
  if (0xd < uVar23) {
switchD_00147938_caseD_1:
    __kmp_msg_format(&local_60,0x40058);
    __kmp_msg_format(&local_78,0x50016);
    __kmp_fatal();
  }
  obj = (void *)((long)&switchD_00147938::switchdataD_00164010 +
                (long)(int)(&switchD_00147938::switchdataD_00164010)[uVar23]);
  switch(uVar23) {
  case 0:
  case 2:
    if ((pdVar22->u).p32.field_6.parm1 == 0) {
      (pdVar22->u).p32.field_6.parm1 = 1;
    }
    break;
  default:
    goto switchD_00147938_caseD_1;
  case 6:
    uVar23 = (pkVar3->th).th_team_nproc * 2;
    obj = (void *)(iterations / uVar23);
    if (uVar7 < uVar23) {
      obj = (void *)0x1;
    }
    uVar8 = (uint)obj;
    uVar23 = uVar8;
    if ((uint)chunk < uVar8) {
      uVar23 = chunk;
    }
    if (chunk == 0) {
      uVar23 = 1;
    }
    uVar13 = ((uVar23 + uVar8 + uVar7 * 2) - 1) / (uVar23 + uVar8);
    uVar7 = 2;
    if (2 < uVar13) {
      uVar7 = uVar13;
    }
    (pdVar22->u).p32.field_6.parm1 = uVar23;
    (pdVar22->u).p32.field_6.parm2 = uVar8;
    (pdVar22->u).p32.field_6.parm3 = uVar7;
    (pdVar22->u).p32.field_6.parm4 = (uVar8 - uVar23) / (uVar7 - 1);
    sVar21 = kmp_sch_trapezoidal;
    break;
  case 7:
    uVar13 = (pkVar3->th).th_team_nproc;
    if (1 < (int)uVar13) {
      uVar7 = ((uVar7 + uVar13) - 1) / uVar13;
    }
    (pdVar22->u).p32.field_6.parm1 = uVar7;
    sVar21 = kmp_sch_static_greedy;
    goto LAB_00147b3b;
  case 8:
    uVar23 = (pkVar3->th).th_team_nproc;
LAB_001479c9:
    if (uVar23 < 2) {
      if (uVar7 == 0) {
LAB_00147d67:
        (pdVar22->u).p32.count = 1;
        (pdVar22->u).p32.field_6.parm1 = 0;
        sVar21 = kmp_sch_static_balanced;
        break;
      }
      (pdVar22->u).p32.field_6.parm1 = 1;
      uVar8 = 0;
      obj = (void *)(ulong)(uVar7 - 1);
    }
    else {
      uVar13 = *(uint *)(__kmp_threads[gtid]->th_pad + 0x20);
      obj = (void *)(ulong)uVar13;
      if (uVar7 < uVar23) {
        if (uVar7 <= uVar13) goto LAB_00147d67;
        *(uint *)((long)&pdVar22->u + 0x20) = (uint)(uVar13 == uVar7 - 1);
        uVar8 = uVar13;
      }
      else {
        iVar19 = (int)(iterations / uVar23);
        uVar7 = (uint)(iterations % (ulong)uVar23);
        uVar8 = uVar7;
        if (uVar13 < uVar7) {
          uVar8 = uVar13;
        }
        uVar8 = uVar8 + iVar19 * uVar13;
        *(uint *)((long)&pdVar22->u + 0x20) = (uint)(uVar13 == uVar23 - 1);
        obj = (void *)(ulong)(iVar19 + uVar8 + -1 + (uint)(uVar13 < uVar7));
      }
    }
    kVar14 = (kmp_uint32)obj;
    if (bVar25) {
      local_c0 = (ulong)((kVar14 - uVar8) + 1);
    }
    if (bVar24) {
      (pdVar22->u).p32.lb = uVar8 + lb;
      uVar23 = lb + kVar14;
    }
    else {
      uVar23 = kVar14 * st + lb;
      (pdVar22->u).p32.lb = uVar8 * st + lb;
      if (st < 1) {
        if (uVar23 + st < ub) {
          uVar23 = ub;
        }
      }
      else if (ub < uVar23 + st) {
        uVar23 = ub;
      }
    }
    (pdVar22->u).p32.ub = uVar23;
    sVar21 = kmp_sch_static_balanced;
    if (pdVar22->ordered != 0) {
      (pdVar22->u).p32.ordered_lower = uVar8;
      (pdVar22->u).p32.ordered_upper = kVar14;
    }
    break;
  case 9:
  case 0xd:
    uVar12 = (ulong)(uint)(pkVar3->th).th_team_nproc;
    if (uVar12 < 2) {
      (pdVar22->u).p32.field_6.parm1 = uVar7;
      sVar21 = kmp_sch_static_greedy;
    }
    else {
      obj = (void *)(((long)chunk * 2 + 1) * uVar12);
      if ((long)obj < (long)iterations) {
        uVar23 = (chunk * 2 + 2) * (pkVar3->th).th_team_nproc;
        obj = (void *)(ulong)uVar23;
        (pdVar22->u).p32.field_6.parm2 = uVar23;
        *(double *)((long)&pdVar22->u + 0x28) = 0.5 / (double)uVar12;
      }
      else {
        sVar21 = kmp_sch_dynamic_chunked;
      }
    }
    break;
  case 10:
    uVar12 = (ulong)(uint)(pkVar3->th).th_team_nproc;
    if (1 < uVar12) {
      obj = (void *)(((long)chunk * 2 + 1) * uVar12);
      if ((long)obj < (long)iterations) {
        lVar27 = (((longdouble)chunk + (longdouble)chunk + (longdouble)1) * (longdouble)uVar12) /
                 (longdouble)iterations;
        base = (double)((longdouble)-0.5 / (longdouble)uVar12 + (longdouble)1);
        *(double *)((long)&pdVar22->u + 0x28) = base;
        x = (longdouble)base;
        lVar28 = in_ST3;
        lVar29 = in_ST3;
        lVar31 = in_ST3;
        __kmp_pow<unsigned_int>((longdouble *)0xe5,x,(uint)pkVar18);
        uVar8 = 0;
        uVar23 = 0xe5;
        if (lVar27 < in_ST0) {
          uVar23 = 0xe5;
          do {
            uVar8 = uVar23;
            in_ST0 = in_ST0 * in_ST0;
            uVar23 = uVar8 * 2;
            if (in_ST0 <= lVar27) break;
          } while (uVar8 < 0x4000000);
        }
        while (uVar16 = uVar23, lVar30 = lVar31, lVar26 = in_ST3, uVar13 = (uint)pkVar18,
              uVar8 + 1 < uVar16) {
          uVar23 = uVar16 + uVar8 >> 1;
          lVar31 = lVar30;
          __kmp_pow<unsigned_int>((longdouble *)(ulong)uVar23,x,uVar13);
          bVar24 = lVar27 < in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = lVar26;
          in_ST3 = lVar28;
          lVar28 = lVar29;
          lVar29 = lVar30;
          if (bVar24) {
            uVar8 = uVar23;
            uVar23 = uVar16;
          }
        }
        if (((uVar16 == 0) ||
            (__kmp_pow<unsigned_int>((longdouble *)(ulong)(uVar16 - 1),x,uVar13), in_ST1 <= lVar27))
           || (__kmp_pow<unsigned_int>((longdouble *)(ulong)uVar16,x,uVar13), lVar27 < in_ST2)) {
          __kmp_debug_assert("assertion failure",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/daniel-schuermann[P]openmp/runtime/src/kmp_dispatch.cpp"
                             ,0x412);
        }
        (pdVar22->u).p32.field_6.parm2 = uVar16;
        uVar9 = __kmp_dispatch_guided_remaining<unsigned_int>(uVar7,base,uVar16);
        (pdVar22->u).p32.count = uVar7 - (chunk * uVar16 + uVar9);
        sVar21 = kmp_sch_guided_analytical_chunked;
      }
      else {
        sVar21 = kmp_sch_dynamic_chunked;
      }
      break;
    }
LAB_00147c75:
    (pdVar22->u).p32.field_6.parm1 = uVar7;
    goto LAB_00147c79;
  case 0xb:
    uVar23 = *(uint *)(pkVar3->th_pad + 100);
    uVar8 = ((int)(iterations / (uint)chunk) + 1) -
            (uint)((int)(iterations % (ulong)(uint)chunk) == 0);
    if ((uVar23 < 2) || (uVar8 < uVar23)) goto LAB_001479c9;
    uVar13 = *(uint *)(__kmp_threads[gtid]->th_pad + 0x20);
    uVar16 = uVar8 % uVar23;
    uVar7 = uVar16;
    if (uVar13 < uVar16) {
      uVar7 = uVar13;
    }
    iVar19 = uVar7 + (uVar8 / uVar23) * uVar13;
    (pdVar22->u).p32.count = iVar19;
    (pdVar22->u).p32.ub = iVar19 + uVar8 / uVar23 + (uint)(uVar13 < uVar16);
    (pdVar22->u).p32.field_6.parm2 = lb;
    uVar13 = uVar13 + 1;
    (pdVar22->u).p32.field_6.parm4 = uVar13 % uVar23;
    (pdVar22->u).p32.st = st;
    sVar21 = kmp_sch_static_steal;
LAB_00147b3b:
    obj = (void *)(ulong)uVar13;
    break;
  case 0xc:
    uVar23 = (pkVar3->th).th_team_nproc;
    obj = (void *)(ulong)uVar23;
    if (uVar23 < 2) goto LAB_00147c75;
    (pdVar22->u).p32.field_6.parm1 = -chunk & (((uVar7 + uVar23) - 1) / uVar23 + chunk) - 1;
LAB_00147c79:
    sVar21 = kmp_sch_static_greedy;
  }
  pdVar22->schedule = sVar21;
  if (iVar2 == 0) {
    __kmp_wait_yield<unsigned_int>(&local_100->buffer_index,local_108,__kmp_eq<unsigned_int>,obj);
    ((pkVar3->th).th_dispatch)->th_dispatch_pr_current = pdVar22;
    ((pkVar3->th).th_dispatch)->th_dispatch_sh_current = local_100;
    if (pdVar22->ordered != 0) {
      __kmp_itt_ordered_init(gtid);
    }
    if (bVar25) {
      switch(sVar21) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        kStackY_160 = 0;
        break;
      default:
        kStackY_160 = 3;
        break;
      case kmp_sch_dynamic_chunked:
        kStackY_160 = 1;
        break;
      case kmp_sch_static_greedy:
        local_c0 = (ulong)(uint)(pdVar22->u).p32.field_6.parm1;
        kStackY_160 = 0;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        kStackY_160 = 2;
      }
      __kmp_itt_metadata_loop(loc,kStackY_160,iterations,local_c0);
    }
  }
  if (sVar21 == kmp_sch_static_steal) {
    pkVar1 = &(pdVar22->u).p32.static_steal_counter;
    *pkVar1 = *pkVar1 + 1;
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(ident_t *loc, int gtid, enum sched_type schedule, T lb,
                    T ub, typename traits_t<T>::signed_t st,
                    typename traits_t<T>::signed_t chunk, int push_ws) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  kmp_uint32 my_buffer_index;
  dispatch_private_info_template<T> *pr;
  dispatch_shared_info_template<UT> volatile *sh;

  KMP_BUILD_ASSERT(sizeof(dispatch_private_info_template<T>) ==
                   sizeof(dispatch_private_info));
  KMP_BUILD_ASSERT(sizeof(dispatch_shared_info_template<UT>) ==
                   sizeof(dispatch_shared_info));

  if (!TCR_4(__kmp_init_parallel))
    __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
  SSC_MARK_DISPATCH_INIT();
#endif
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init: T#%%d called: schedule:%%d "
                            "chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
                            traits_t<ST>::spec, traits_t<T>::spec,
                            traits_t<T>::spec, traits_t<ST>::spec);
    KD_TRACE(10, (buff, gtid, schedule, chunk, lb, ub, st));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;
  th->th.th_ident = loc;

#if USE_ITT_BUILD
  kmp_uint64 cur_chunk = chunk;
  int itt_need_metadata_reporting = __itt_metadata_add_ptr &&
                                    __kmp_forkjoin_frames_mode == 3 &&
                                    KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
                                    th->th.th_teams_microtask == NULL &&
#endif
                                    team->t.t_active_level == 1;
#endif
  if (!active) {
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_disp_buffer); /* top of the stack */
  } else {
    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    my_buffer_index = th->th.th_dispatch->th_disp_index++;

    /* What happens when number of threads changes, need to resize buffer? */
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        &th->th.th_dispatch
             ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    sh = reinterpret_cast<dispatch_shared_info_template<UT> volatile *>(
        &team->t.t_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
  }

#if (KMP_STATIC_STEAL_ENABLED)
  if (SCHEDULE_HAS_NONMONOTONIC(schedule))
    // AC: we now have only one implementation of stealing, so use it
    schedule = kmp_sch_static_steal;
  else
#endif
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->ordered = FALSE;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init: kmp_sch_auto: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }

    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked &&
        th->th.th_team_nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init: T#%%d new: schedule:%%d"
                                " chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

  // Any half-decent optimizer will remove this test when the blocks are empty
  // since the macros expand to nothing when statistics are disabled.
  if (schedule == __kmp_static) {
    KMP_COUNT_BLOCK(OMP_FOR_static);
    KMP_COUNT_VALUE(FOR_static_iterations, tc);
  } else {
    KMP_COUNT_BLOCK(OMP_FOR_dynamic);
    KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
  }

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->ordered == 0) {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo_error;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo_error;
    } else {
      pr->ordered_bumped = 0;

      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;

      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo<UT>;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo<UT>;
    }
  }

  if (__kmp_env_consistency_check) {
    enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
    if (push_ws) {
      __kmp_push_workshare(gtid, ws, loc);
      pr->pushed_ws = ws;
    } else {
      __kmp_check_workshare(gtid, ws, loc);
      pr->pushed_ws = ct_none;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T nproc = th->th.th_team_nproc;
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_FOR_static_steal);
      T id = __kmp_tid_from_gtid(gtid);
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // pr->pfields.parm3 = 0; // it's not used in static_steal
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
  } // case
#endif
  case kmp_sch_static_balanced: {
    T nproc = th->th.th_team_nproc;
    T init, limit;

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                   gtid));

    if (nproc > 1) {
      T id = __kmp_tid_from_gtid(gtid);

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else { // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_iterative_chunked:
  case kmp_sch_guided_simd: {
    T nproc = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked"
                   " case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",
                     gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    T nproc = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked"
                   " case\n",
                   gtid));
    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_OS_WINDOWS && KMP_ARCH_X86
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_OS_WINDOWS && KMP_ARCH_X86
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n", gtid));
    pr->u.p.parm1 = (th->th.th_team_nproc > 1)
                        ? (tc + th->th.th_team_nproc - 1) / th->th.th_team_nproc
                        : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * th->th.th_team_nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
  if (active) {
    /* The name of this buffer should be my_buffer_index when it's free to use
     * it */

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));
    __kmp_wait_yield<kmp_uint32>(&sh->buffer_index, my_buffer_index,
                                 __kmp_eq<kmp_uint32> USE_ITT_BUILD_ARG(NULL));
    // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and
    // my_buffer_index are *always* 32-bit integers.
    KMP_MB(); /* is this necessary? */
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));

    th->th.th_dispatch->th_dispatch_pr_current = (dispatch_private_info_t *)pr;
    th->th.th_dispatch->th_dispatch_sh_current =
        CCAST(dispatch_shared_info_t *, (volatile dispatch_shared_info_t *)sh);
#if USE_ITT_BUILD
    if (pr->ordered) {
      __kmp_itt_ordered_init(gtid);
    }
    // Report loop metadata
    if (itt_need_metadata_reporting) {
      // Only report metadata by master of active team at level 1
      kmp_uint64 schedtype = 0;
      switch (schedule) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced: // Chunk is calculated in the switch above
        break;
      case kmp_sch_static_greedy:
        cur_chunk = pr->u.p.parm1;
        break;
      case kmp_sch_dynamic_chunked:
        schedtype = 1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        schedtype = 2;
        break;
      default:
        // Should we put this case under "static"?
        // case kmp_sch_static_steal:
        schedtype = 3;
        break;
      }
      __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
    }
#endif /* USE_ITT_BUILD */
  }

#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s "
        "lb:%%%s ub:%%%s"
        " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s"
        " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
        traits_t<UT>::spec, traits_t<T>::spec, traits_t<T>::spec,
        traits_t<ST>::spec, traits_t<UT>::spec, traits_t<UT>::spec,
        traits_t<UT>::spec, traits_t<UT>::spec, traits_t<T>::spec,
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
                  pr->u.p.st, pr->u.p.tc, pr->u.p.count, pr->u.p.ordered_lower,
                  pr->u.p.ordered_upper, pr->u.p.parm1, pr->u.p.parm2,
                  pr->u.p.parm3, pr->u.p.parm4));
    __kmp_str_free(&buff);
  }
#endif
#if (KMP_STATIC_STEAL_ENABLED)
  // It cannot be guaranteed that after execution of a loop with some other
  // schedule kind all the parm3 variables will contain the same value. Even if
  // all parm3 will be the same, it still exists a bad case like using 0 and 1
  // rather than program life-time increment. So the dedicated variable is
  // required. The 'static_steal_counter' is used.
  if (schedule == kmp_sch_static_steal) {
    // Other threads will inspect this variable when searching for a victim.
    // This is a flag showing that other threads may steal from this thread
    // since then.
    volatile T *p = &pr->u.p.static_steal_counter;
    *p = *p + 1;
  }
#endif // ( KMP_STATIC_STEAL_ENABLED )

#if OMPT_SUPPORT && OMPT_OPTIONAL
  if (ompt_enabled.ompt_callback_work) {
    ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
    ompt_task_info_t *task_info = __ompt_get_task_info_object(0);
    kmp_info_t *thr = __kmp_threads[gtid];
    ompt_callbacks.ompt_callback(ompt_callback_work)(
        ompt_work_loop, ompt_scope_begin, &(team_info->parallel_data),
        &(task_info->task_data), tc, OMPT_LOAD_RETURN_ADDRESS(gtid));
  }
#endif
}